

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

uint32 __thiscall Js::FunctionBody::GetCountField(FunctionBody *this,CounterFields fieldEnum)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  ThreadContext *pTVar5;
  undefined4 *puVar6;
  
  bVar1 = (this->counters).field_0x1;
  pTVar5 = ThreadContext::GetContextForCurrentThread();
  if ((pTVar5 == (ThreadContext *)0x0) && ((bVar1 & 1) == 0)) {
    bVar3 = CCLock::IsLocked(&ThreadContext::s_csThreadContext.super_CCLock);
    if (bVar3) {
      bVar3 = CCLock::IsLocked(&(((this->super_ParseableFunctionInfo).super_FunctionProxy.
                                 m_scriptContext)->threadContext->csFunctionBody).super_CCLock);
      if (bVar3) goto LAB_007645ca;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x100,
                                "(ThreadContext::GetContextForCurrentThread() || isCountersLockedDown || (ThreadContext::GetCriticalSection()->IsLocked() && this->m_scriptContext->GetThreadContext()->GetFunctionBodyLock()->IsLocked()))"
                                ,
                                "ThreadContext::GetContextForCurrentThread() || isCountersLockedDown || (ThreadContext::GetCriticalSection()->IsLocked() && this->m_scriptContext->GetThreadContext()->GetFunctionBodyLock()->IsLocked())"
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
LAB_007645ca:
  uVar4 = CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields>::Get
                    (&this->counters,fieldEnum);
  return uVar4;
}

Assistant:

uint32 FunctionBody::GetCountField(FunctionBody::CounterFields fieldEnum) const
    {
#if DBG
        bool isCountersLockedDown = counters.isLockedDown;
        Assert(ThreadContext::GetContextForCurrentThread() || isCountersLockedDown
            || (ThreadContext::GetCriticalSection()->IsLocked() && this->m_scriptContext->GetThreadContext()->GetFunctionBodyLock()->IsLocked())); // etw rundown
#endif
        return counters.Get(fieldEnum);
    }